

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O1

xmlChar * xmlTextReaderReadOuterXml(xmlTextReaderPtr reader)

{
  xmlNodePtr pxVar1;
  xmlOutputBufferPtr output;
  xmlChar *pxVar2;
  
  pxVar1 = xmlTextReaderExpand(reader);
  if ((pxVar1 != (xmlNodePtr)0x0) && (pxVar1 = reader->node, pxVar1 != (xmlNodePtr)0x0)) {
    output = xmlAllocOutputBuffer((xmlCharEncodingHandlerPtr)0x0);
    if (output != (xmlOutputBufferPtr)0x0) {
      xmlTextReaderDumpCopy(reader,output,pxVar1);
      if (output->error != 0) {
        xmlCtxtErrIO(reader->ctxt,output->error,(char *)0x0);
      }
      pxVar2 = xmlBufDetach(output->buffer);
      xmlOutputBufferClose(output);
      return pxVar2;
    }
    xmlTextReaderErrMemory(reader);
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlTextReaderReadOuterXml(xmlTextReaderPtr reader)
{
    xmlOutputBufferPtr output;
    xmlNodePtr node;
    xmlChar *ret;

    if (xmlTextReaderExpand(reader) == NULL)
        return(NULL);

    node = reader->node;
    if (node == NULL)
        return(NULL);

    output = xmlAllocOutputBuffer(NULL);
    if (output == NULL) {
        xmlTextReaderErrMemory(reader);
        return(NULL);
    }

    xmlTextReaderDumpCopy(reader, output, node);
    if (output->error)
        xmlCtxtErrIO(reader->ctxt, output->error, NULL);

    ret = xmlBufDetach(output->buffer);
    xmlOutputBufferClose(output);

    return(ret);
}